

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<double,double,double>
               (ImGuiDataType data_type,double *v,float v_speed,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  uint in_ECX;
  double *in_RSI;
  float in_EDI;
  float in_XMM0_Da;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [64];
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  ImGuiDataType unaff_retaddr;
  float v_new_parametric_1;
  float v_new_parametric;
  float v_old_parametric;
  int decimal_precision_1;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  double v_old_ref_for_accum_remainder;
  double v_cur;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_logarithmic;
  bool is_clamped;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  size_t in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar8;
  byte bVar9;
  undefined8 in_stack_ffffffffffffff90;
  double dVar10;
  undefined8 in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa8;
  float fVar11;
  undefined1 in_stack_ffffffffffffffb8;
  byte bVar12;
  undefined4 in_stack_ffffffffffffffe8;
  ImGuiDataType in_stack_fffffffffffffffc;
  undefined1 extraout_var [56];
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_ECX & 0x100000) != 0);
  bVar9 = in_EDI == 1.12104e-44 || in_EDI == 1.26117e-44;
  bVar12 = in_XMM1_Qa < in_XMM2_Qa;
  bVar8 = (in_ECX & 0x20) != 0 && (bool)bVar9;
  if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) && ((bool)bVar12)) &&
     (in_XMM2_Qa - in_XMM1_Qa < 3.4028234663852886e+38)) {
    in_XMM0_Da = (float)((in_XMM2_Qa - in_XMM1_Qa) * (double)GImGui->DragSpeedDefaultRatio);
  }
  fVar11 = 0.0;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar2 = IsMousePosValid((ImVec2 *)
                               CONCAT17(bVar9,CONCAT16(bVar8,CONCAT24(in_stack_ffffffffffffff74,
                                                                      in_stack_ffffffffffffff70)))),
      bVar2)) &&
     (bVar2 = IsMouseDragPastThreshold(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60), bVar2))
  {
    pfVar4 = ImVec2::operator[]((ImVec2 *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff58);
    fVar11 = *pfVar4;
    if (((pIVar1->IO).KeyAlt & 1U) != 0) {
      fVar11 = fVar11 * 0.01;
    }
    if (((pIVar1->IO).KeyShift & 1U) != 0) {
      fVar11 = fVar11 * 10.0;
    }
  }
  else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((bVar9 & 1) != 0) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                  CONCAT13(in_stack_ffffffffffffff6b,
                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                    CONCAT11(in_stack_ffffffffffffff69,
                                                             in_stack_ffffffffffffff68)))),
                 in_stack_ffffffffffffff64);
    }
    in_stack_ffffffffffffff6c = in_XMM0_Da;
    auVar7._0_8_ = GetNavInputAmount2d((ImGuiNavDirSourceFlags)
                                       ((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                       (ImGuiInputReadMode)in_stack_ffffffffffffff98,
                                       (float)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                       (float)in_stack_ffffffffffffff90);
    auVar7._8_56_ = extraout_var;
    in_stack_ffffffffffffffa8 = (double)vmovlpd_avx(auVar7._0_16_);
    pfVar4 = ImVec2::operator[]((ImVec2 *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                in_stack_ffffffffffffff58);
    fVar11 = *pfVar4;
    fVar5 = GetMinimumStepAtDecimalPrecision((int)in_stack_ffffffffffffff60);
    in_XMM0_Da = ImMax<float>(in_stack_ffffffffffffff6c,fVar5);
  }
  fVar11 = in_XMM0_Da * fVar11;
  if (uVar3 == 1) {
    fVar11 = -fVar11;
  }
  if ((((bVar8 & 1) != 0) && (in_XMM2_Qa - in_XMM1_Qa < 3.4028234663852886e+38)) &&
     (9.999999974752427e-07 < in_XMM2_Qa - in_XMM1_Qa)) {
    fVar11 = fVar11 / (float)(in_XMM2_Qa - in_XMM1_Qa);
  }
  bVar2 = false;
  if (((bVar12 & 1) != 0) &&
     ((*in_RSI < in_XMM2_Qa || (in_stack_ffffffffffffff6a = true, bVar2 = true, fVar11 <= 0.0)))) {
    in_stack_ffffffffffffff69 = *in_RSI <= in_XMM1_Qa && fVar11 < 0.0;
    in_stack_ffffffffffffff6a = in_stack_ffffffffffffff69;
    bVar2 = (bool)in_stack_ffffffffffffff69;
  }
  if (((pIVar1->ActiveIdIsJustActivated & 1U) == 0) && (bVar2 == false)) {
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      pIVar1->DragCurrentAccum = fVar11 + pIVar1->DragCurrentAccum;
      pIVar1->DragCurrentAccumDirty = true;
    }
  }
  else {
    pIVar1->DragCurrentAccum = 0.0;
    pIVar1->DragCurrentAccumDirty = false;
  }
  if ((pIVar1->DragCurrentAccumDirty & 1U) == 0) {
    bVar2 = false;
  }
  else {
    dVar10 = 0.0;
    if ((bVar8 & 1) == 0) {
      dVar6 = (double)pIVar1->DragCurrentAccum + *in_RSI;
    }
    else {
      if ((bVar9 & 1) != 0) {
        ImParseFormatPrecision
                  ((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                    CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffff6a,
                                                            CONCAT11(in_stack_ffffffffffffff69,
                                                                     in_stack_ffffffffffffff68)))),
                   in_stack_ffffffffffffff64);
      }
      ImPow(0.0,3.00385e-39);
      fVar5 = ScaleRatioFromValueT<double,double,double>
                        (unaff_retaddr,(double)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (double)in_RSI,(double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_XMM1_Qa >> 0x38,0),SUB84(in_XMM1_Qa,0),
                         (float)((ulong)in_XMM2_Qa >> 0x20));
      dVar6 = ScaleValueFromRatioT<double,double,double>
                        (in_stack_fffffffffffffffc,in_EDI,(double)in_RSI,
                         (double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_XMM1_Qa >> 0x38,0),SUB84(in_XMM1_Qa,0),
                         (float)((ulong)in_XMM2_Qa >> 0x20));
      dVar10 = (double)fVar5;
    }
    if ((in_ECX & 0x40) == 0) {
      dVar6 = RoundScalarWithFormatT<double,double>
                        ((char *)CONCAT44(uVar3,CONCAT13(bVar9,CONCAT12(bVar12,CONCAT11(bVar8,
                                                  in_stack_ffffffffffffffb8)))),
                         (ImGuiDataType)fVar11,in_stack_ffffffffffffffa8);
    }
    pIVar1->DragCurrentAccumDirty = false;
    if ((bVar8 & 1) == 0) {
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)(dVar6 - *in_RSI);
    }
    else {
      fVar5 = ScaleRatioFromValueT<double,double,double>
                        (unaff_retaddr,(double)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                         (double)in_RSI,(double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),
                         SUB81((ulong)in_XMM1_Qa >> 0x38,0),SUB84(in_XMM1_Qa,0),
                         (float)((ulong)in_XMM2_Qa >> 0x20));
      pIVar1->DragCurrentAccum = pIVar1->DragCurrentAccum - (float)((double)fVar5 - dVar10);
    }
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      dVar6 = 0.0;
    }
    if (((*in_RSI != dVar6) || (NAN(*in_RSI) || NAN(dVar6))) && ((bVar12 & 1) != 0)) {
      if ((dVar6 < in_XMM1_Qa) || (((*in_RSI < dVar6 && (fVar11 < 0.0)) && ((bVar9 & 1) == 0)))) {
        dVar6 = in_XMM1_Qa;
      }
      if ((in_XMM2_Qa < dVar6) || (((dVar6 < *in_RSI && (0.0 < fVar11)) && ((bVar9 & 1) == 0)))) {
        dVar6 = in_XMM2_Qa;
      }
    }
    if ((*in_RSI != dVar6) || (NAN(*in_RSI) || NAN(dVar6))) {
      *in_RSI = dVar6;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}